

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

ulong __thiscall CVmObjDict::rebuild_image(CVmObjDict *this,char *buf,ulong buflen)

{
  vm_dict_ext *pvVar1;
  void *in_RDX;
  _func_void_void_ptr_CVmHashEntry_ptr *in_RSI;
  CVmHashTable *in_RDI;
  rebuild_ctx ctx;
  _func_void_void_ptr_CVmHashEntry_ptr *func;
  CVmHashTable *this_00;
  _func_void_void_ptr_CVmHashEntry_ptr *local_8;
  
  this_00 = in_RDI;
  get_ext((CVmObjDict *)in_RDI);
  CVmHashTable::enum_entries(this_00,in_RSI,in_RDX);
  if (in_RDX < (void *)0x6) {
    local_8 = (_func_void_void_ptr_CVmHashEntry_ptr *)0x6;
  }
  else {
    local_8 = in_RSI;
    pvVar1 = get_ext((CVmObjDict *)in_RDI);
    ::oswp4(in_RSI,(ulong)pvVar1->comparator_);
    ::oswp2(local_8 + 4,0);
    func = local_8;
    get_ext((CVmObjDict *)in_RDI);
    CVmHashTable::enum_entries(this_00,func,in_RDX);
    local_8 = local_8 + (6 - (long)func);
  }
  return (ulong)local_8;
}

Assistant:

ulong CVmObjDict::rebuild_image(VMG_ char *buf, ulong buflen)
{
    rebuild_ctx ctx;
    
    /* 
     *   calculate the amount of space we need - start with the comparator
     *   object, which needs four bytes, and the entry count, which needs two
     *   bytes 
     */
    ctx.space_needed = 6;

    /* enumerate the entries to count space */
    ctx.entry_cnt = 0;
    get_ext()->hashtab_->enum_entries(&rebuild_cb_1, &ctx);

    /* if we need more space than is available, ask for more */
    if (ctx.space_needed > buflen)
        return ctx.space_needed;

    /* write the comparator object and the entry count */
    oswp4(buf, get_ext()->comparator_);
    oswp2(buf + 4, ctx.entry_cnt);

    /* start writing after the count */
    ctx.dst = buf + 6;

    /* enumerate the entries to write to the image buffer */
    get_ext()->hashtab_->enum_entries(&rebuild_cb_2, &ctx);

    /* return the size */
    return ctx.dst - buf;
}